

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcipher.cpp
# Opt level: O3

void __thiscall QSslCipher::QSslCipher(QSslCipher *this)

{
  _Head_base<0UL,_QSslCipherPrivate_*,_false> _Var1;
  
  _Var1._M_head_impl = (QSslCipherPrivate *)operator_new(0x98);
  (_Var1._M_head_impl)->isNull = true;
  ((_Var1._M_head_impl)->protocolString).d.d = 0;
  *(char16_t **)((long)&(_Var1._M_head_impl)->protocolString + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(_Var1._M_head_impl)->protocolString + 0x10) = 0;
  ((_Var1._M_head_impl)->name).d.d = 0;
  *(char16_t **)((long)&(_Var1._M_head_impl)->name + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(_Var1._M_head_impl)->name + 0x10) = 0;
  (_Var1._M_head_impl)->supportedBits = 0;
  (_Var1._M_head_impl)->bits = 0;
  ((_Var1._M_head_impl)->keyExchangeMethod).d.d = 0;
  *(char16_t **)((long)&(_Var1._M_head_impl)->keyExchangeMethod + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(_Var1._M_head_impl)->keyExchangeMethod + 0x10) = 0;
  ((_Var1._M_head_impl)->authenticationMethod).d.d = 0;
  *(char16_t **)((long)&(_Var1._M_head_impl)->authenticationMethod + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(_Var1._M_head_impl)->authenticationMethod + 0x10) = 0;
  ((_Var1._M_head_impl)->encryptionMethod).d.d = 0;
  *(char16_t **)((long)&(_Var1._M_head_impl)->encryptionMethod + 8) = (char16_t *)0x0;
  *(undefined8 *)((long)&(_Var1._M_head_impl)->encryptionMethod + 9) = 0;
  *(undefined8 *)((long)&(_Var1._M_head_impl)->encryptionMethod + 0x11) = 0;
  (_Var1._M_head_impl)->protocol = UnknownProtocol;
  (this->d)._M_t.super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>.
  _M_t.super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
  super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl = _Var1._M_head_impl;
  return;
}

Assistant:

QSslCipher::QSslCipher()
    : d(new QSslCipherPrivate)
{
}